

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>
* mwheel::
  Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
  ::get_instance(bool reset)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  byte in_DIL;
  creator_type creator;
  shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
  *in_stack_ffffffffffffffa8;
  __shared_ptr_access<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb0;
  function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
  *in_stack_ffffffffffffffb8;
  function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
  *in_stack_ffffffffffffffc0;
  __shared_ptr_access<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  local_28 [39];
  byte local_1;
  
  local_1 = in_DIL & 1;
  if ((Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
       ::get_instance(bool)::pnt_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                                   ::get_instance(bool)::pnt_abi_cxx11_), iVar2 != 0)) {
    std::
    shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
    ::shared_ptr((shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
                  *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_atexit(std::
                 shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
                 ::~shared_ptr,
                 &Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                  ::get_instance(bool)::pnt_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                         ::get_instance(bool)::pnt_abi_cxx11_);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                      ::get_instance(bool)::pnt_abi_cxx11_);
  if ((!bVar1) || ((local_1 & 1) != 0)) {
    check_creator();
    get_creator();
    in_stack_ffffffffffffffb0 = local_28;
    std::
    function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
    ::function(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::
    function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
    ::operator()(in_stack_ffffffffffffffb8);
    std::
    shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
    ::operator=((shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
                 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::
    shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
    ::~shared_ptr((shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
                   *)0x151271);
    std::
    function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
    ::~function((function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
                 *)0x15127b);
  }
  peVar3 = std::
           __shared_ptr_access<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(in_stack_ffffffffffffffb0);
  return peVar3;
}

Assistant:

static T &get_instance(bool reset = false) {
    static auto pnt = std::shared_ptr<T>(nullptr);
    if (!pnt || reset) {
      check_creator();
      auto creator = get_creator();
      pnt = creator();
    }
    return *pnt;
  }